

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  ulong local_e8;
  int128_t ce;
  int128_t cd;
  int64_t se;
  int64_t sd;
  int64_t me;
  int64_t md;
  int64_t r;
  int64_t q;
  int64_t v;
  int64_t u;
  int64_t e4;
  int64_t e3;
  int64_t e2;
  int64_t e1;
  int64_t e0;
  int64_t d4;
  int64_t d3;
  int64_t d2;
  int64_t d1;
  int64_t d0;
  int64_t M62;
  secp256k1_modinv64_modinfo *modinfo_local;
  secp256k1_modinv64_trans2x2 *t_local;
  secp256k1_modinv64_signed62 *e_local;
  secp256k1_modinv64_signed62 *d_local;
  
  lVar21 = d->v[0];
  lVar1 = d->v[1];
  lVar2 = d->v[2];
  lVar3 = d->v[3];
  lVar4 = d->v[4];
  lVar5 = e->v[0];
  lVar6 = e->v[1];
  lVar7 = e->v[2];
  lVar8 = e->v[3];
  lVar9 = e->v[4];
  uVar10 = t->u;
  uVar11 = t->v;
  uVar12 = t->q;
  uVar13 = t->r;
  lVar15 = (uVar10 & lVar4 >> 0x3f) + (uVar11 & lVar9 >> 0x3f);
  lVar16 = (uVar12 & lVar4 >> 0x3f) + (uVar13 & lVar9 >> 0x3f);
  uVar17 = uVar10 * lVar21 + uVar11 * lVar5;
  uVar22 = uVar12 * lVar21 + uVar13 * lVar5;
  lVar15 = lVar15 - (modinfo->modulus_inv62 * uVar17 + lVar15 & 0x3fffffffffffffff);
  lVar16 = lVar16 - (modinfo->modulus_inv62 * uVar22 + lVar16 & 0x3fffffffffffffff);
  lVar14 = (modinfo->modulus).v[0];
  uVar18 = lVar14 * lVar15;
  lVar19 = SUB168(SEXT816((long)uVar10) * SEXT816(lVar21),8) +
           SUB168(SEXT816((long)uVar11) * SEXT816(lVar5),8) +
           (ulong)CARRY8(uVar10 * lVar21,uVar11 * lVar5) +
           SUB168(SEXT816(lVar14) * SEXT816(lVar15),8) + (ulong)CARRY8(uVar17,uVar18);
  lVar14 = (modinfo->modulus).v[0];
  uVar20 = lVar14 * lVar16;
  lVar21 = SUB168(SEXT816((long)uVar12) * SEXT816(lVar21),8) +
           SUB168(SEXT816((long)uVar13) * SEXT816(lVar5),8) +
           (ulong)CARRY8(uVar12 * lVar21,uVar13 * lVar5) +
           SUB168(SEXT816(lVar14) * SEXT816(lVar16),8) + (ulong)CARRY8(uVar22,uVar20);
  uVar17 = lVar19 * 4 | uVar17 + uVar18 >> 0x3e;
  uVar18 = lVar21 * 4 | uVar22 + uVar20 >> 0x3e;
  uVar20 = uVar10 * lVar1 + uVar11 * lVar6;
  ce._8_8_ = uVar17 + uVar20;
  cd._0_8_ = (lVar19 >> 0x3e) +
             SUB168(SEXT816((long)uVar10) * SEXT816(lVar1),8) +
             SUB168(SEXT816((long)uVar11) * SEXT816(lVar6),8) +
             (ulong)CARRY8(uVar10 * lVar1,uVar11 * lVar6) + (ulong)CARRY8(uVar17,uVar20);
  uVar17 = uVar12 * lVar1 + uVar13 * lVar6;
  local_e8 = uVar18 + uVar17;
  ce._0_8_ = (lVar21 >> 0x3e) +
             SUB168(SEXT816((long)uVar12) * SEXT816(lVar1),8) +
             SUB168(SEXT816((long)uVar13) * SEXT816(lVar6),8) +
             (ulong)CARRY8(uVar12 * lVar1,uVar13 * lVar6) + (ulong)CARRY8(uVar18,uVar17);
  if ((modinfo->modulus).v[1] != 0) {
    lVar21 = (modinfo->modulus).v[1];
    uVar17 = lVar21 * lVar15;
    bVar29 = CARRY8(ce._8_8_,uVar17);
    ce._8_8_ = ce._8_8_ + uVar17;
    cd._0_8_ = (long)cd + SUB168(SEXT816(lVar21) * SEXT816(lVar15),8) + (ulong)bVar29;
    lVar21 = (modinfo->modulus).v[1];
    uVar17 = lVar21 * lVar16;
    bVar29 = CARRY8(local_e8,uVar17);
    local_e8 = local_e8 + uVar17;
    ce._0_8_ = (long)ce + SUB168(SEXT816(lVar21) * SEXT816(lVar16),8) + (ulong)bVar29;
  }
  d->v[0] = ce._8_8_ & 0x3fffffffffffffff;
  uVar18 = (long)cd << 2 | ce._8_8_ >> 0x3e;
  e->v[0] = local_e8 & 0x3fffffffffffffff;
  uVar17 = (long)ce << 2 | local_e8 >> 0x3e;
  uVar20 = uVar10 * lVar2 + uVar11 * lVar7;
  ce._8_8_ = uVar18 + uVar20;
  cd._0_8_ = ((long)cd >> 0x3e) +
             SUB168(SEXT816((long)uVar10) * SEXT816(lVar2),8) +
             SUB168(SEXT816((long)uVar11) * SEXT816(lVar7),8) +
             (ulong)CARRY8(uVar10 * lVar2,uVar11 * lVar7) + (ulong)CARRY8(uVar18,uVar20);
  uVar18 = uVar12 * lVar2 + uVar13 * lVar7;
  local_e8 = uVar17 + uVar18;
  ce._0_8_ = ((long)ce >> 0x3e) +
             SUB168(SEXT816((long)uVar12) * SEXT816(lVar2),8) +
             SUB168(SEXT816((long)uVar13) * SEXT816(lVar7),8) +
             (ulong)CARRY8(uVar12 * lVar2,uVar13 * lVar7) + (ulong)CARRY8(uVar17,uVar18);
  if ((modinfo->modulus).v[2] != 0) {
    lVar21 = (modinfo->modulus).v[2];
    uVar17 = lVar21 * lVar15;
    bVar29 = CARRY8(ce._8_8_,uVar17);
    ce._8_8_ = ce._8_8_ + uVar17;
    cd._0_8_ = (long)cd + SUB168(SEXT816(lVar21) * SEXT816(lVar15),8) + (ulong)bVar29;
    lVar21 = (modinfo->modulus).v[2];
    uVar17 = lVar21 * lVar16;
    bVar29 = CARRY8(local_e8,uVar17);
    local_e8 = local_e8 + uVar17;
    ce._0_8_ = (long)ce + SUB168(SEXT816(lVar21) * SEXT816(lVar16),8) + (ulong)bVar29;
  }
  d->v[1] = ce._8_8_ & 0x3fffffffffffffff;
  uVar18 = (long)cd << 2 | ce._8_8_ >> 0x3e;
  e->v[1] = local_e8 & 0x3fffffffffffffff;
  uVar17 = (long)ce << 2 | local_e8 >> 0x3e;
  uVar20 = uVar10 * lVar3 + uVar11 * lVar8;
  ce._8_8_ = uVar18 + uVar20;
  cd._0_8_ = ((long)cd >> 0x3e) +
             SUB168(SEXT816((long)uVar10) * SEXT816(lVar3),8) +
             SUB168(SEXT816((long)uVar11) * SEXT816(lVar8),8) +
             (ulong)CARRY8(uVar10 * lVar3,uVar11 * lVar8) + (ulong)CARRY8(uVar18,uVar20);
  uVar18 = uVar12 * lVar3 + uVar13 * lVar8;
  local_e8 = uVar17 + uVar18;
  ce._0_8_ = ((long)ce >> 0x3e) +
             SUB168(SEXT816((long)uVar12) * SEXT816(lVar3),8) +
             SUB168(SEXT816((long)uVar13) * SEXT816(lVar8),8) +
             (ulong)CARRY8(uVar12 * lVar3,uVar13 * lVar8) + (ulong)CARRY8(uVar17,uVar18);
  if ((modinfo->modulus).v[3] != 0) {
    lVar21 = (modinfo->modulus).v[3];
    uVar17 = lVar21 * lVar15;
    bVar29 = CARRY8(ce._8_8_,uVar17);
    ce._8_8_ = ce._8_8_ + uVar17;
    cd._0_8_ = (long)cd + SUB168(SEXT816(lVar21) * SEXT816(lVar15),8) + (ulong)bVar29;
    lVar21 = (modinfo->modulus).v[3];
    uVar17 = lVar21 * lVar16;
    bVar29 = CARRY8(local_e8,uVar17);
    local_e8 = local_e8 + uVar17;
    ce._0_8_ = (long)ce + SUB168(SEXT816(lVar21) * SEXT816(lVar16),8) + (ulong)bVar29;
  }
  d->v[2] = ce._8_8_ & 0x3fffffffffffffff;
  uVar22 = (long)cd << 2 | ce._8_8_ >> 0x3e;
  e->v[2] = local_e8 & 0x3fffffffffffffff;
  uVar17 = (long)ce << 2 | local_e8 >> 0x3e;
  uVar27 = uVar10 * lVar4 + uVar11 * lVar9;
  uVar23 = uVar22 + uVar27;
  uVar28 = uVar12 * lVar4 + uVar13 * lVar9;
  uVar24 = uVar17 + uVar28;
  lVar21 = (modinfo->modulus).v[4];
  uVar18 = lVar21 * lVar15;
  uVar25 = uVar23 + uVar18;
  lVar1 = (modinfo->modulus).v[4];
  uVar20 = lVar1 * lVar16;
  uVar26 = uVar24 + uVar20;
  d->v[3] = uVar25 & 0x3fffffffffffffff;
  e->v[3] = uVar26 & 0x3fffffffffffffff;
  d->v[4] = (((long)cd >> 0x3e) +
             SUB168(SEXT816((long)uVar10) * SEXT816(lVar4),8) +
             SUB168(SEXT816((long)uVar11) * SEXT816(lVar9),8) +
             (ulong)CARRY8(uVar10 * lVar4,uVar11 * lVar9) + (ulong)CARRY8(uVar22,uVar27) +
             SUB168(SEXT816(lVar21) * SEXT816(lVar15),8) + (ulong)CARRY8(uVar23,uVar18)) * 4 |
            uVar25 >> 0x3e;
  e->v[4] = (((long)ce >> 0x3e) +
             SUB168(SEXT816((long)uVar12) * SEXT816(lVar4),8) +
             SUB168(SEXT816((long)uVar13) * SEXT816(lVar9),8) +
             (ulong)CARRY8(uVar12 * lVar4,uVar13 * lVar9) + (ulong)CARRY8(uVar17,uVar28) +
             SUB168(SEXT816(lVar1) * SEXT816(lVar16),8) + (ulong)CARRY8(uVar24,uVar20)) * 4 |
            uVar26 >> 0x3e;
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    int128_t cd, ce;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK((secp256k1_modinv64_abs(u) + secp256k1_modinv64_abs(v)) >= 0); /* |u|+|v| doesn't overflow */
    VERIFY_CHECK((secp256k1_modinv64_abs(q) + secp256k1_modinv64_abs(r)) >= 0); /* |q|+|r| doesn't overflow */
    VERIFY_CHECK((secp256k1_modinv64_abs(u) + secp256k1_modinv64_abs(v)) <= M62 + 1); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK((secp256k1_modinv64_abs(q) + secp256k1_modinv64_abs(r)) <= M62 + 1); /* |q|+|r| <= 2^62 */
#endif
    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    cd = (int128_t)u * d0 + (int128_t)v * e0;
    ce = (int128_t)q * d0 + (int128_t)r * e0;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * (uint64_t)cd + md) & M62;
    me -= (modinfo->modulus_inv62 * (uint64_t)ce + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int128_t)modinfo->modulus.v[0] * md;
    ce += (int128_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int64_t)cd & M62) == 0); cd >>= 62;
    VERIFY_CHECK(((int64_t)ce & M62) == 0); ce >>= 62;
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    cd += (int128_t)u * d1 + (int128_t)v * e1;
    ce += (int128_t)q * d1 + (int128_t)r * e1;
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        cd += (int128_t)modinfo->modulus.v[1] * md;
        ce += (int128_t)modinfo->modulus.v[1] * me;
    }
    d->v[0] = (int64_t)cd & M62; cd >>= 62;
    e->v[0] = (int64_t)ce & M62; ce >>= 62;
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    cd += (int128_t)u * d2 + (int128_t)v * e2;
    ce += (int128_t)q * d2 + (int128_t)r * e2;
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        cd += (int128_t)modinfo->modulus.v[2] * md;
        ce += (int128_t)modinfo->modulus.v[2] * me;
    }
    d->v[1] = (int64_t)cd & M62; cd >>= 62;
    e->v[1] = (int64_t)ce & M62; ce >>= 62;
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    cd += (int128_t)u * d3 + (int128_t)v * e3;
    ce += (int128_t)q * d3 + (int128_t)r * e3;
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        cd += (int128_t)modinfo->modulus.v[3] * md;
        ce += (int128_t)modinfo->modulus.v[3] * me;
    }
    d->v[2] = (int64_t)cd & M62; cd >>= 62;
    e->v[2] = (int64_t)ce & M62; ce >>= 62;
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    cd += (int128_t)u * d4 + (int128_t)v * e4;
    ce += (int128_t)q * d4 + (int128_t)r * e4;
    cd += (int128_t)modinfo->modulus.v[4] * md;
    ce += (int128_t)modinfo->modulus.v[4] * me;
    d->v[3] = (int64_t)cd & M62; cd >>= 62;
    e->v[3] = (int64_t)ce & M62; ce >>= 62;
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = (int64_t)cd;
    e->v[4] = (int64_t)ce;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
#endif
}